

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O0

Expression *
slang::ast::Expression::bindLookupResult
          (Compilation *comp,LookupResult *result,SourceRange sourceRange,
          InvocationExpressionSyntax *invocation,ArrayOrRandomizeMethodExpressionSyntax *withClause,
          ASTContext *context)

{
  SourceRange sourceRange_00;
  span<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_18446744073709551615UL>
  selectors_00;
  SourceRange range;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  SourceRange range_00;
  SourceRange sourceRange_03;
  bool bVar1;
  long lVar2;
  VariableSymbol *pVVar3;
  SubroutineSymbol *pSVar4;
  LookupResult *result_00;
  add_pointer_t<slang::ast::LookupResult::MemberSelector> ptVar5;
  span<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_18446744073709551615UL>
  *psVar6;
  Type *virtualInterface;
  ASTContext *context_00;
  size_type sVar7;
  SourceLocation in_RCX;
  SourceLocation in_RDX;
  Compilation *in_RSI;
  SourceLocation in_RDI;
  LookupResult *in_R8;
  InvocationExpressionSyntax *in_R9;
  SourceRange SVar8;
  ASTContext *unaff_retaddr;
  long in_stack_00000008;
  ElementSelectSyntax *selectSyntax;
  span<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_18446744073709551615UL>
  selectors;
  LookupResult nextResult;
  add_pointer_t<slang::ast::LookupResult::MemberSelector> memberSelect;
  variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
  *selector;
  size_t i;
  HierarchicalReference hierRef_1;
  bool isDottedAccess;
  HierarchicalReference hierRef;
  bool constraintAllowed;
  SourceRange callRange_1;
  InvocationExpressionSyntax *localInvoke;
  SourceRange callRange;
  Expression *expr;
  Symbol *sym;
  Scope *scope;
  DataTypeExpression *expr_1;
  Type *resultType;
  anon_class_32_4_8f84bd9b errorIfInvoke;
  Symbol *symbol;
  ASTContext *in_stack_00000668;
  InvocationExpressionSyntax *in_stack_00000670;
  Symbol *in_stack_00000678;
  SourceRange in_stack_00000680;
  SourceLocation in_stack_fffffffffffffa98;
  uint uVar9;
  undefined4 uVar10;
  ASTContext *context_01;
  SourceLocation in_stack_fffffffffffffaa0;
  SmallVector<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_4UL>
  *in_stack_fffffffffffffaa8;
  span<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_18446744073709551615UL>
  *in_stack_fffffffffffffab0;
  Type *in_stack_fffffffffffffab8;
  SourceLocation in_stack_fffffffffffffac0;
  SourceLocation in_stack_fffffffffffffac8;
  undefined8 in_stack_fffffffffffffad0;
  DiagCode code;
  LookupResult *in_stack_fffffffffffffad8;
  undefined7 in_stack_fffffffffffffae0;
  undefined1 in_stack_fffffffffffffae7;
  anon_class_32_4_8f84bd9b *in_stack_fffffffffffffae8;
  undefined7 in_stack_fffffffffffffaf0;
  undefined1 in_stack_fffffffffffffaf7;
  undefined5 in_stack_fffffffffffffb18;
  undefined1 in_stack_fffffffffffffb1d;
  undefined1 in_stack_fffffffffffffb1e;
  undefined1 in_stack_fffffffffffffb1f;
  LookupResult *in_stack_fffffffffffffb20;
  undefined7 in_stack_fffffffffffffb28;
  undefined1 in_stack_fffffffffffffb2f;
  undefined7 in_stack_fffffffffffffb38;
  bool bVar11;
  undefined4 in_stack_fffffffffffffb60;
  undefined4 in_stack_fffffffffffffb64;
  undefined1 in_stack_fffffffffffffb68 [16];
  Compilation *in_stack_fffffffffffffb78;
  ASTContext local_458 [5];
  ASTContext *in_stack_fffffffffffffcc0;
  ArrayOrRandomizeMethodExpressionSyntax *in_stack_fffffffffffffcc8;
  InvocationExpressionSyntax *in_stack_fffffffffffffcd0;
  Expression *in_stack_fffffffffffffcd8;
  Subroutine *in_stack_fffffffffffffce0;
  Compilation *in_stack_fffffffffffffce8;
  SourceRange in_stack_fffffffffffffd00;
  span<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_18446744073709551615UL>
  *psVar12;
  span<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_18446744073709551615UL>
  *index;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffe00;
  undefined7 in_stack_fffffffffffffe08;
  undefined1 in_stack_fffffffffffffe0f;
  SourceLocation in_stack_fffffffffffffe10;
  ArrayOrRandomizeMethodExpressionSyntax *in_stack_fffffffffffffe18;
  LookupResult *in_stack_fffffffffffffe20;
  MemberSelector *in_stack_fffffffffffffe28;
  Expression *in_stack_fffffffffffffe30;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe86;
  undefined1 in_stack_fffffffffffffe87;
  HierarchicalReference *in_stack_fffffffffffffe88;
  Symbol *in_stack_fffffffffffffe90;
  ASTContext *in_stack_fffffffffffffe98;
  undefined8 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  bitmask<slang::ast::LookupResultFlags> local_139 [17];
  undefined8 local_128;
  InvocationExpressionSyntax *local_120;
  SourceLocation local_118;
  SourceLocation local_110;
  SubroutineSymbol *local_108;
  ASTContext *in_stack_ffffffffffffff30;
  Symbol *in_stack_ffffffffffffff38;
  SourceLocation in_stack_ffffffffffffff40;
  SourceLocation in_stack_ffffffffffffff48;
  bitmask<slang::ast::CompilationFlags> local_a4;
  bitmask<slang::ast::ASTFlags> local_a0;
  Scope *local_98;
  bitmask<slang::ast::VariableFlags> local_8a;
  Expression *local_88;
  Type *local_70;
  bitmask<slang::ast::ASTFlags> local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_48;
  VariableSymbol *this;
  SourceLocation SVar13;
  Expression *local_8;
  
  code = SUB84((ulong)in_stack_fffffffffffffad0 >> 0x20,0);
  this = (VariableSymbol *)(in_RSI->super_BumpAllocator).head;
  if (this == (VariableSymbol *)0x0) {
    local_8 = badExpr((Compilation *)in_stack_fffffffffffffaa0,
                      (Expression *)in_stack_fffffffffffffa98);
  }
  else {
    local_60 = &stack0xffffffffffffffd0;
    local_58 = &stack0xffffffffffffffe8;
    local_48 = &stack0xffffffffffffffc8;
    lVar2 = in_stack_00000008 + 0x10;
    bitmask<slang::ast::ASTFlags>::bitmask(&local_68,AllowDataType);
    bVar1 = bitmask<slang::ast::ASTFlags>::has
                      ((bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffab0,
                       (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffaa8);
    bVar11 = false;
    if (bVar1) {
      bVar11 = Symbol::isType((Symbol *)0x993185);
    }
    if (bVar11 == false) {
      bVar1 = false;
      if ((this->super_ValueSymbol).super_Symbol.kind == Variable) {
        bVar11 = SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                 ::empty((SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                          *)&(in_RSI->options).maxCheckerInstanceDepth);
        bVar1 = false;
        if (bVar11) {
          Symbol::as<slang::ast::VariableSymbol>((Symbol *)0x9932b5);
          bitmask<slang::ast::VariableFlags>::bitmask(&local_8a,CompilerGenerated);
          bVar1 = bitmask<slang::ast::VariableFlags>::has
                            ((bitmask<slang::ast::VariableFlags> *)in_stack_fffffffffffffaa0,
                             (bitmask<slang::ast::VariableFlags> *)in_stack_fffffffffffffa98);
        }
      }
      if (bVar1 != false) {
        local_98 = Symbol::getParentScope((Symbol *)this);
        bVar1 = false;
        if ((local_98 != (Scope *)0x0) && (bVar1 = true, in_R8 == (LookupResult *)0x0)) {
          bitmask<slang::ast::ASTFlags>::bitmask(&local_a0,TopLevelStatement);
          bVar11 = bitmask<slang::ast::ASTFlags>::has
                             ((bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffab0,
                              (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffaa8);
          bVar1 = false;
          if (bVar11) {
            bitmask<slang::ast::CompilationFlags>::bitmask(&local_a4,AllowRecursiveImplicitCall);
            bVar1 = Compilation::hasFlag
                              ((Compilation *)in_stack_fffffffffffffa98,
                               (bitmask<slang::ast::CompilationFlags>)
                               in_stack_fffffffffffffaa0._4_4_);
          }
        }
        if (((bVar1 != false) &&
            (pVVar3 = (VariableSymbol *)Scope::asSymbol(local_98),
            (pVVar3->super_ValueSymbol).super_Symbol.kind == Subroutine)) &&
           (pSVar4 = Symbol::as<slang::ast::SubroutineSymbol>((Symbol *)0x99341c),
           pSVar4->returnValVar == this)) {
          this = pVVar3;
        }
      }
      switch((this->super_ValueSymbol).super_Symbol.kind) {
      case Subroutine:
        SVar13 = in_RDX;
        if (in_R8 != (LookupResult *)0x0) {
          SVar8 = slang::syntax::SyntaxNode::sourceRange
                            ((SyntaxNode *)
                             CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0));
          in_RDX = SVar8.startLoc;
          in_RCX = SVar8.endLoc;
        }
        local_108 = Symbol::as<slang::ast::SubroutineSymbol>((Symbol *)0x9934df);
        std::variant<slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
        ::
        variant<slang::ast::SubroutineSymbol_const*,void,void,slang::ast::SubroutineSymbol_const*,void>
                  ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                    *)in_stack_fffffffffffffaa0,(SubroutineSymbol **)in_stack_fffffffffffffa98);
        in_stack_fffffffffffffaa0 = in_RCX;
        in_stack_fffffffffffffa98 = in_RDX;
        local_118 = in_stack_fffffffffffffa98;
        local_110 = in_stack_fffffffffffffaa0;
        local_8 = CallExpression::fromLookup
                            (in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
                             in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,
                             in_stack_fffffffffffffcc8,in_stack_fffffffffffffd00,
                             in_stack_fffffffffffffcc0);
        in_R8 = (LookupResult *)0x0;
        in_R9 = (InvocationExpressionSyntax *)0x0;
        break;
      default:
        result_00 = (LookupResult *)(in_stack_00000008 + 0x10);
        bitmask<slang::ast::ASTFlags>::bitmask
                  ((bitmask<slang::ast::ASTFlags> *)&stack0xfffffffffffffe38,LValue);
        uVar10 = in_stack_fffffffffffffa98._4_4_;
        bVar1 = bitmask<slang::ast::ASTFlags>::has
                          ((bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffab0,
                           (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffaa8);
        bVar11 = false;
        in_stack_fffffffffffffe00._M_extent_value = (size_t)in_RDX;
        if (bVar1) {
          bVar1 = SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                  ::empty((SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                           *)&(in_RSI->options).maxCheckerInstanceDepth);
          bVar11 = false;
          in_stack_fffffffffffffe00._M_extent_value = (size_t)in_RDX;
          if (!bVar1) {
            SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
            ::operator[]((SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                          *)&(in_RSI->options).maxCheckerInstanceDepth,0);
            ptVar5 = std::
                     get_if<slang::ast::LookupResult::MemberSelector,slang::syntax::ElementSelectSyntax_const*,slang::ast::LookupResult::MemberSelector>
                               ((variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                                 *)0x99389c);
            bVar11 = ptVar5 != (add_pointer_t<slang::ast::LookupResult::MemberSelector>)0x0;
            in_stack_fffffffffffffe00._M_extent_value = (size_t)in_RDX;
          }
        }
        HierarchicalReference::fromLookup
                  ((Compilation *)CONCAT17(bVar11,in_stack_fffffffffffffae0),result_00);
        in_stack_fffffffffffffe08 = in_RCX._0_7_;
        in_stack_fffffffffffffe0f = in_RCX._7_1_;
        in_stack_fffffffffffffa98._1_3_ = 0;
        in_stack_fffffffffffffa98._0_1_ = bVar11;
        in_stack_fffffffffffffa98._4_4_ = uVar10;
        sourceRange_02.endLoc._0_4_ = in_stack_fffffffffffffea8;
        sourceRange_02.startLoc = (SourceLocation)in_stack_fffffffffffffea0;
        sourceRange_02.endLoc._4_4_ = in_stack_fffffffffffffeac;
        SVar13 = (SourceLocation)in_stack_fffffffffffffe00._M_extent_value;
        local_8 = ValueExpressionBase::fromSymbol
                            (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                             in_stack_fffffffffffffe88,sourceRange_02,
                             (bool)in_stack_fffffffffffffe87,(bool)in_stack_fffffffffffffe86);
        break;
      case ConstraintBlock:
        bVar1 = SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                ::empty((SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                         *)&(in_RSI->options).maxCheckerInstanceDepth);
        uVar9 = in_stack_fffffffffffffa98._4_4_;
        bVar1 = (bool)((bVar1 ^ 0xffU) & 1);
        HierarchicalReference::fromLookup
                  ((Compilation *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
                   in_stack_fffffffffffffad8);
        in_stack_fffffffffffffa98 = (SourceLocation)((ulong)uVar9 << 0x20);
        sourceRange_01.endLoc._0_4_ = in_stack_fffffffffffffea8;
        sourceRange_01.startLoc = (SourceLocation)in_stack_fffffffffffffea0;
        sourceRange_01.endLoc._4_4_ = in_stack_fffffffffffffeac;
        local_8 = ValueExpressionBase::fromSymbol
                            (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                             in_stack_fffffffffffffe88,sourceRange_01,bVar1,
                             (bool)in_stack_fffffffffffffe86);
        SVar13 = in_RDX;
        break;
      case Sequence:
      case Property:
      case LetDecl:
        local_120 = (InvocationExpressionSyntax *)0x0;
        bVar1 = SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                ::empty((SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                         *)&(in_RSI->options).maxCheckerInstanceDepth);
        SVar13 = in_RDX;
        if (bVar1) {
          local_128 = 0;
          local_120 = std::
                      exchange<slang::syntax::InvocationExpressionSyntax_const*,decltype(nullptr)>
                                ((InvocationExpressionSyntax **)in_stack_fffffffffffffaa0,
                                 (void **)in_stack_fffffffffffffa98);
          SVar13 = in_RDX;
        }
        local_8 = AssertionInstanceExpression::fromLookup
                            (in_stack_00000678,in_stack_00000670,in_stack_00000680,in_stack_00000668
                            );
        bVar1 = false;
        if ((this->super_ValueSymbol).super_Symbol.kind == LetDecl) {
          in_stack_fffffffffffffae8 =
               (anon_class_32_4_8f84bd9b *)&(in_RSI->options).maxInstanceDepth;
          bitmask<slang::ast::LookupResultFlags>::bitmask(local_139,IsHierarchical);
          bVar1 = bitmask<slang::ast::LookupResultFlags>::has
                            ((bitmask<slang::ast::LookupResultFlags> *)in_stack_fffffffffffffaa0,
                             (bitmask<slang::ast::LookupResultFlags> *)in_stack_fffffffffffffa98);
        }
        if (bVar1 != false) {
          if (local_120 != (InvocationExpressionSyntax *)0x0) {
            slang::syntax::SyntaxNode::sourceRange
                      ((SyntaxNode *)CONCAT17(bVar1,in_stack_fffffffffffffaf0));
          }
          sourceRange_00.endLoc = in_stack_fffffffffffffac8;
          sourceRange_00.startLoc = in_stack_fffffffffffffac0;
          ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffab8,code,sourceRange_00);
        }
        break;
      case AssertionPort:
        range_00.endLoc = in_stack_ffffffffffffff48;
        range_00.startLoc = in_stack_ffffffffffffff40;
        local_8 = AssertionInstanceExpression::bindPort
                            (in_stack_ffffffffffffff38,range_00,in_stack_ffffffffffffff30);
        SVar13 = in_RDX;
      }
      psVar12 = (span<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_18446744073709551615UL>
                 *)0x0;
      while (index = psVar12,
            psVar6 = (span<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_18446744073709551615UL>
                      *)SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                        ::size((SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                                *)&(in_RSI->options).maxCheckerInstanceDepth), psVar12 < psVar6) {
        virtualInterface =
             (Type *)SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                     ::operator[]((SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                                   *)&(in_RSI->options).maxCheckerInstanceDepth,(size_type)index);
        context_00 = (ASTContext *)
                     std::
                     get_if<slang::ast::LookupResult::MemberSelector,slang::syntax::ElementSelectSyntax_const*,slang::ast::LookupResult::MemberSelector>
                               ((variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                                 *)0x9939a1);
        if (context_00 == (ASTContext *)0x0) {
          std::
          get<slang::syntax::ElementSelectSyntax_const*,slang::syntax::ElementSelectSyntax_const*,slang::ast::LookupResult::MemberSelector>
                    ((variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                      *)0x993c84);
          local_8 = bindSelector(in_stack_fffffffffffffb78,in_stack_fffffffffffffb68._8_8_,
                                 in_stack_fffffffffffffb68._0_8_,
                                 (ASTContext *)
                                 CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60));
          psVar6 = in_stack_fffffffffffffab0;
        }
        else {
          not_null<const_slang::ast::Type_*>::operator->
                    ((not_null<const_slang::ast::Type_*> *)0x9939c9);
          uVar10 = in_stack_fffffffffffffa98._4_4_;
          psVar6 = index;
          bVar1 = Type::isVirtualInterface((Type *)0x9939d1);
          if (bVar1) {
            LookupResult::LookupResult((LookupResult *)in_stack_fffffffffffffaa0);
            std::
            span<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_18446744073709551615UL>
            ::
            span<slang::SmallVector<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_4UL>_&>
                      (in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
            not_null<const_slang::ast::Type_*>::operator*
                      ((not_null<const_slang::ast::Type_*> *)0x993a11);
            std::
            span<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_18446744073709551615UL>
            ::subspan(in_stack_fffffffffffffab0,(size_type)in_stack_fffffffffffffaa8,
                      (size_type)in_stack_fffffffffffffaa0);
            context_01 = local_458;
            range.startLoc._7_1_ = in_stack_fffffffffffffe0f;
            range.startLoc._0_7_ = in_stack_fffffffffffffe08;
            range.endLoc = in_stack_fffffffffffffe10;
            selectors_00._M_extent._M_extent_value = in_stack_fffffffffffffe00._M_extent_value;
            selectors_00._M_ptr = (pointer)psVar6;
            Lookup::selectChild(virtualInterface,range,selectors_00,context_00,
                                in_stack_fffffffffffffe20);
            LookupResult::reportDiags((LookupResult *)in_stack_fffffffffffffaa0,context_01);
            if (local_458[0].scope.ptr == (Scope *)0x0) {
              local_8 = badExpr((Compilation *)in_stack_fffffffffffffaa0,(Expression *)context_01);
            }
            else {
              sourceRange_03.endLoc = SVar13;
              sourceRange_03.startLoc = in_RDI;
              local_8 = bindLookupResult(in_RSI,in_R8,sourceRange_03,in_R9,
                                         (ArrayOrRandomizeMethodExpressionSyntax *)this,
                                         unaff_retaddr);
            }
            LookupResult::~LookupResult((LookupResult *)in_stack_fffffffffffffaa0);
            return local_8;
          }
          index = psVar6;
          sVar7 = SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                  ::size((SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                          *)&(in_RSI->options).maxCheckerInstanceDepth);
          if (psVar6 == (span<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_18446744073709551615UL>
                         *)(sVar7 - 1)) {
            in_stack_fffffffffffffa98._4_4_ = uVar10;
            in_stack_fffffffffffffa98._0_4_ = 1;
            local_8 = MemberAccessExpression::fromSelector
                                ((Compilation *)in_stack_fffffffffffffe38.m_bits,
                                 in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                                 (InvocationExpressionSyntax *)in_stack_fffffffffffffe20,
                                 in_stack_fffffffffffffe18,(ASTContext *)in_stack_fffffffffffffe10,
                                 (bool)in_stack_fffffffffffffe0f);
            if (local_8->kind == Call) {
              in_R8 = (LookupResult *)0x0;
              in_R9 = (InvocationExpressionSyntax *)0x0;
            }
          }
          else {
            in_stack_fffffffffffffa98._4_4_ = uVar10;
            in_stack_fffffffffffffa98._0_4_ = 1;
            local_8 = MemberAccessExpression::fromSelector
                                ((Compilation *)in_stack_fffffffffffffe38.m_bits,
                                 in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                                 (InvocationExpressionSyntax *)in_stack_fffffffffffffe20,
                                 in_stack_fffffffffffffe18,(ASTContext *)in_stack_fffffffffffffe10,
                                 (bool)in_stack_fffffffffffffe0f);
          }
        }
        psVar12 = (span<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_18446744073709551615UL>
                   *)((long)&(((_Variant_base<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                                *)&index->_M_ptr)->
                             super__Move_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                             ).
                             super__Copy_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                             .
                             super__Move_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                             .
                             super__Copy_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                             .
                             super__Variant_storage_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                             ._M_u + 1);
        in_stack_fffffffffffffab0 = psVar6;
      }
      bVar1 = bad((Expression *)in_stack_fffffffffffffaa0);
      if ((!bVar1) &&
         (bVar1 = bindLookupResult::anon_class_32_4_8f84bd9b::operator()(in_stack_fffffffffffffae8),
         !bVar1)) {
        local_8 = badExpr((Compilation *)in_stack_fffffffffffffaa0,
                          (Expression *)in_stack_fffffffffffffa98);
      }
    }
    else {
      SVar8.endLoc._0_7_ = in_stack_fffffffffffffb38;
      SVar8.startLoc = (SourceLocation)lVar2;
      SVar8.endLoc._7_1_ = bVar11;
      local_70 = Type::fromLookupResult
                           ((Compilation *)
                            CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28),
                            in_stack_fffffffffffffb20,SVar8,
                            (ASTContext *)
                            CONCAT17(in_stack_fffffffffffffb1f,
                                     CONCAT16(in_stack_fffffffffffffb1e,
                                              CONCAT15(in_stack_fffffffffffffb1d,
                                                       in_stack_fffffffffffffb18))));
      local_88 = &BumpAllocator::
                  emplace<slang::ast::DataTypeExpression,slang::ast::Type_const&,slang::SourceRange&>
                            ((BumpAllocator *)in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                             (SourceRange *)in_stack_fffffffffffffab0)->super_Expression;
      bVar1 = bad((Expression *)in_stack_fffffffffffffaa0);
      if ((bVar1) ||
         (bVar1 = bindLookupResult::anon_class_32_4_8f84bd9b::operator()(in_stack_fffffffffffffae8),
         bVar1)) {
        local_8 = local_88;
      }
      else {
        local_8 = badExpr((Compilation *)in_stack_fffffffffffffaa0,
                          (Expression *)in_stack_fffffffffffffa98);
      }
    }
  }
  return local_8;
}

Assistant:

Expression& Expression::bindLookupResult(Compilation& comp, LookupResult& result,
                                         SourceRange sourceRange,
                                         const InvocationExpressionSyntax* invocation,
                                         const ArrayOrRandomizeMethodExpressionSyntax* withClause,
                                         const ASTContext& context) {
    const Symbol* symbol = result.found;
    if (!symbol)
        return badExpr(comp, nullptr);

    auto errorIfInvoke = [&]() {
        // If we require a subroutine, enforce that now. The invocation syntax will have been
        // nulled out if we used it elsewhere in this function.
        if (invocation) {
            SourceLocation loc = invocation->arguments ? invocation->arguments->openParen.location()
                                                       : sourceRange.start();
            auto& diag = context.addDiag(diag::ExpressionNotCallable, loc);
            diag << sourceRange;
            return false;
        }
        else if (withClause) {
            context.addDiag(diag::UnexpectedWithClause, withClause->with.range());
            return false;
        }
        return true;
    };

    if (context.flags.has(ASTFlags::AllowDataType) && symbol->isType()) {
        // We looked up a named data type and we were allowed to do so, so return it.
        const Type& resultType = Type::fromLookupResult(comp, result, sourceRange, context);
        auto expr = comp.emplace<DataTypeExpression>(resultType, sourceRange);
        if (!expr->bad() && !errorIfInvoke())
            return badExpr(comp, expr);

        return *expr;
    }

    // If we've found a function's return value variable and have parentheses for
    // a call expression, translate that symbol to be the subroutine itself to
    // allow for recursive function calls.
    if (symbol->kind == SymbolKind::Variable && result.selectors.empty() &&
        symbol->as<VariableSymbol>().flags.has(VariableFlags::CompilerGenerated)) {

        auto scope = symbol->getParentScope();
        if (scope && (invocation || (context.flags.has(ASTFlags::TopLevelStatement) &&
                                     comp.hasFlag(CompilationFlags::AllowRecursiveImplicitCall)))) {
            auto& sym = scope->asSymbol();
            if (sym.kind == SymbolKind::Subroutine &&
                sym.as<SubroutineSymbol>().returnValVar == symbol) {
                SLANG_ASSERT(sym.as<SubroutineSymbol>().subroutineKind == SubroutineKind::Function);
                symbol = &sym;
            }
        }
    }

    Expression* expr;
    switch (symbol->kind) {
        case SymbolKind::Subroutine: {
            SLANG_ASSERT(result.selectors.empty());
            SourceRange callRange = invocation ? invocation->sourceRange() : sourceRange;
            expr = &CallExpression::fromLookup(comp, &symbol->as<SubroutineSymbol>(), nullptr,
                                               invocation, withClause, callRange, context);
            invocation = nullptr;
            withClause = nullptr;
            break;
        }
        case SymbolKind::Sequence:
        case SymbolKind::Property:
        case SymbolKind::LetDecl: {
            const InvocationExpressionSyntax* localInvoke = nullptr;
            if (result.selectors.empty())
                localInvoke = std::exchange(invocation, nullptr);

            expr = &AssertionInstanceExpression::fromLookup(*symbol, localInvoke, sourceRange,
                                                            context);

            if (symbol->kind == SymbolKind::LetDecl &&
                result.flags.has(LookupResultFlags::IsHierarchical)) {
                SourceRange callRange = localInvoke ? localInvoke->sourceRange() : sourceRange;
                context.addDiag(diag::LetHierarchical, callRange);
            }
            break;
        }
        case SymbolKind::AssertionPort:
            expr = &AssertionInstanceExpression::bindPort(*symbol, sourceRange, context);
            break;
        case SymbolKind::ConstraintBlock: {
            // If there are selectors then this is ok -- either they will be valid because
            // they're accessing a built-in method or they will issue an error.
            const bool constraintAllowed = !result.selectors.empty();
            auto hierRef = HierarchicalReference::fromLookup(comp, result);
            expr = &ValueExpressionBase::fromSymbol(context, *symbol, &hierRef, sourceRange,
                                                    constraintAllowed);
            break;
        }
        default: {
            const bool isDottedAccess =
                context.flags.has(ASTFlags::LValue) && !result.selectors.empty() &&
                std::get_if<LookupResult::MemberSelector>(&result.selectors[0]) != nullptr;

            auto hierRef = HierarchicalReference::fromLookup(comp, result);
            expr = &ValueExpressionBase::fromSymbol(context, *symbol, &hierRef, sourceRange,
                                                    /* constraintAllowed */ false, isDottedAccess);
            break;
        }
    }

    // Drill down into member accesses.
    for (size_t i = 0; i < result.selectors.size(); i++) {
        auto& selector = result.selectors[i];
        auto memberSelect = std::get_if<LookupResult::MemberSelector>(&selector);
        if (memberSelect) {
            // If this is an access via a virtual interface we need to look at
            // all the selectors together, as this may constitute a hierarchical reference.
            if (expr->type->isVirtualInterface()) {
                LookupResult nextResult;
                std::span<LookupResult::Selector> selectors = result.selectors;
                Lookup::selectChild(*expr->type, expr->sourceRange, selectors.subspan(i), context,
                                    nextResult);

                nextResult.reportDiags(context);
                if (!nextResult.found)
                    return badExpr(comp, expr);

                return bindLookupResult(comp, nextResult, sourceRange, invocation, withClause,
                                        context);
            }

            if (i == result.selectors.size() - 1) {
                expr = &MemberAccessExpression::fromSelector(comp, *expr, *memberSelect, invocation,
                                                             withClause, context,
                                                             /* isFromLookupChain */ true);

                if (expr->kind == ExpressionKind::Call) {
                    invocation = nullptr;
                    withClause = nullptr;
                }
            }
            else {
                expr = &MemberAccessExpression::fromSelector(comp, *expr, *memberSelect, nullptr,
                                                             nullptr, context,
                                                             /* isFromLookupChain */ true);
            }
        }
        else {
            // Element / range selectors.
            auto selectSyntax = std::get<const ElementSelectSyntax*>(selector);
            expr = &bindSelector(comp, *expr, *selectSyntax, context);
        }
    }

    if (!expr->bad() && !errorIfInvoke())
        return badExpr(comp, expr);

    return *expr;
}